

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerGLSL::emit_struct(CompilerGLSL *this,SPIRType *type)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  byte local_a2;
  allocator local_a1;
  string local_a0 [32];
  TypedID *local_80;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end1;
  TypedID<(spirv_cross::Types)1> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range1;
  uint32_t local_58;
  bool emitted;
  uint32_t i;
  char *local_48;
  undefined1 local_40 [8];
  string name;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->type_alias);
  TypedID<(spirv_cross::Types)1>::TypedID
            ((TypedID<(spirv_cross::Types)1> *)((long)&name.field_2 + 0xc),0);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)(name.field_2._M_local_buf + 0xc));
  local_a2 = 0;
  if (uVar2 != uVar3) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->type_alias);
    bVar1 = Compiler::has_extended_decoration
                      (&this->super_Compiler,uVar2,SPIRVCrossDecorationBufferBlockRepacked);
    local_a2 = bVar1 ^ 0xff;
  }
  if ((local_a2 & 1) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    add_resource_name(this,uVar2);
    (*(this->super_Compiler)._vptr_Compiler[0x13])
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,this,
               type,0);
    local_48 = "Construct ";
    if (((this->backend).explicit_struct_type & 1U) != 0) {
      local_48 = "\x05\x05\x04";
    }
    local_48 = local_48 + 3;
    statement<char_const*,std::__cxx11::string&>
              (this,&local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    begin_scope(this);
    ::std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&type->member_name_cache);
    local_58 = 0;
    __range1._7_1_ = 0;
    __begin1 = (TypedID<(spirv_cross::Types)1> *)&type->member_types;
    __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
    member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                       ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
    for (; __end1 != member; __end1 = __end1 + 1) {
      local_80 = (TypedID *)__end1;
      add_member_name(this,type,local_58);
      uVar3 = TypedID::operator_cast_to_unsigned_int(local_80);
      uVar2 = local_58;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0,"",&local_a1);
      (*(this->super_Compiler)._vptr_Compiler[0x15])(this,type,(ulong)uVar3,(ulong)uVar2,local_a0,0)
      ;
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      local_58 = local_58 + 1;
      __range1._7_1_ = 1;
    }
    bVar1 = type_is_empty(this,type);
    if ((bVar1) && (((this->backend).supports_empty_struct & 1U) == 0)) {
      statement<char_const(&)[25]>(this,(char (*) [25])"int empty_struct_member;");
      __range1._7_1_ = 1;
    }
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
    bVar1 = Compiler::has_extended_decoration
                      (&this->super_Compiler,uVar2,SPIRVCrossDecorationPaddingTarget);
    if (bVar1) {
      (*(this->super_Compiler)._vptr_Compiler[0x16])(this,type);
    }
    end_scope_decl(this);
    if ((__range1._7_1_ & 1) != 0) {
      statement<char_const(&)[1]>(this,(char (*) [1])0x65adc5);
    }
    ::std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_struct(SPIRType &type)
{
	// Struct types can be stamped out multiple times
	// with just different offsets, matrix layouts, etc ...
	// Type-punning with these types is legal, which complicates things
	// when we are storing struct and array types in an SSBO for example.
	// If the type master is packed however, we can no longer assume that the struct declaration will be redundant.
	if (type.type_alias != TypeID(0) &&
	    !has_extended_decoration(type.type_alias, SPIRVCrossDecorationBufferBlockRepacked))
		return;

	add_resource_name(type.self);
	auto name = type_to_glsl(type);

	statement(!backend.explicit_struct_type ? "struct " : "", name);
	begin_scope();

	type.member_name_cache.clear();

	uint32_t i = 0;
	bool emitted = false;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		emit_struct_member(type, member, i);
		i++;
		emitted = true;
	}

	// Don't declare empty structs in GLSL, this is not allowed.
	if (type_is_empty(type) && !backend.supports_empty_struct)
	{
		statement("int empty_struct_member;");
		emitted = true;
	}

	if (has_extended_decoration(type.self, SPIRVCrossDecorationPaddingTarget))
		emit_struct_padding_target(type);

	end_scope_decl();

	if (emitted)
		statement("");
}